

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  char *pcVar2;
  void *pvVar3;
  ImGuiColumns *pIVar4;
  ImGuiStoragePair *pIVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  pcVar2 = this->Name;
  if (pcVar2 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  uVar7 = (this->ColumnsStorage).Size;
  if (uVar7 != 0) {
    lVar8 = 0x58;
    uVar9 = 0;
    do {
      pvVar3 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar8);
      if (pvVar3 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
        uVar7 = (this->ColumnsStorage).Size;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x60;
    } while (uVar9 != uVar7);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar4 = (this->ColumnsStorage).Data;
  if (pIVar4 != (ImGuiColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pIVar5 = (this->StateStorage).Data.Data;
  if (pIVar5 != (ImGuiStoragePair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  puVar6 = (this->IDStack).Data;
  if (puVar6 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
  }
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}